

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O1

void DumpData(ostream *out,void *buffer,size_t len)

{
  ostream *poVar1;
  long lVar2;
  ostream oVar3;
  char cVar4;
  undefined4 in_EAX;
  ulong uVar5;
  int i;
  long lVar6;
  undefined4 uStack_38;
  undefined4 local_34;
  
  _uStack_38 = CONCAT44(*(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18),in_EAX);
  if (len != 0) {
    uVar5 = 0;
    do {
      lVar6 = *(long *)out;
      *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(out + *(long *)(lVar6 + -0x18) + 0x10) = 8;
      poVar1 = out + *(long *)(lVar6 + -0x18);
      if (out[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar1);
        poVar1[0xe0] = oVar3;
        poVar1[0xe1] = (ostream)0x1;
      }
      poVar1[0xe0] = (ostream)0x30;
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      lVar6 = 0;
      do {
        if (uVar5 + lVar6 < len) {
          std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
          lVar2 = *(long *)out;
          *(uint *)(out + *(long *)(lVar2 + -0x18) + 0x18) =
               *(uint *)(out + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 2;
          poVar1 = out + *(long *)(lVar2 + -0x18);
          if (out[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
            oVar3 = (ostream)std::ios::widen((char)poVar1);
            poVar1[0xe0] = oVar3;
            poVar1[0xe1] = (ostream)0x1;
          }
          poVar1[0xe0] = (ostream)0x30;
          std::ostream::_M_insert<unsigned_long>((ulong)out);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(out,"   ",3);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
      lVar6 = 8;
      do {
        if (uVar5 + lVar6 < len) {
          std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
          lVar2 = *(long *)out;
          *(uint *)(out + *(long *)(lVar2 + -0x18) + 0x18) =
               *(uint *)(out + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 2;
          poVar1 = out + *(long *)(lVar2 + -0x18);
          if (out[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
            oVar3 = (ostream)std::ios::widen((char)poVar1);
            poVar1[0xe0] = oVar3;
            poVar1[0xe1] = (ostream)0x1;
          }
          poVar1[0xe0] = (ostream)0x30;
          std::ostream::_M_insert<unsigned_long>((ulong)out);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(out,"   ",3);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
      lVar6 = 0;
      do {
        cVar4 = ' ';
        if (uVar5 + lVar6 < len) {
          cVar4 = *(char *)((long)buffer + lVar6);
        }
        if (cVar4 < ' ') {
          cVar4 = '.';
        }
        uStack_38 = CONCAT13(cVar4,(undefined3)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 3),1);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
      buffer = (void *)((long)buffer + 0x10);
      uVar5 = uVar5 + 0x10;
    } while (uVar5 < len);
  }
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = local_34;
  return;
}

Assistant:

void DumpData(std::ostream& out, void* buffer, size_t len)
{
    std::ios_base::fmtflags flags = out.flags();
    const uint8_t* data = reinterpret_cast<const uint8_t*>(buffer);
    size_t index = 0;
    while (index < len)
    {
        out << std::hex << std::setw(8) << std::setfill('0') << index;
        for (int i = 0; i < 8; i++)
        {
            if (index + i < len)
            {
                out << " " << std::hex << std::setw(2) << std::setfill('0') << (uint32_t)data[i];
            }
            else
            {
                out << "   ";
            }
        }
        out << "  ";
        for (int i = 8; i < 16; i++)
        {
            if (index + i < len)
            {
                out << " " << std::hex << std::setw(2) << std::setfill('0') << (uint32_t)data[i];
            }
            else
            {
                out << "   ";
            }
        }
        out << "  ";
        for (int i = 0; i < 16; i++)
        {
            char ch = (index + i < len ? data[i] : ' ');
            out << ((ch < 32) ? '.' : ch);
        }
        out << "\n";
        data += 16;
        index += 16;
    }
    out.flags(flags);
}